

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.cpp
# Opt level: O0

uint256 * ArithToUint256(arith_uint256 *a)

{
  long lVar1;
  base_blob<256U> *in_RDI;
  long in_FS_OFFSET;
  int x;
  base_blob<256U> *ptr;
  undefined4 local_14;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ptr = in_RDI;
  uint256::uint256((uint256 *)in_RDI);
  for (local_14 = 0; local_14 < 8; local_14 = local_14 + 1) {
    base_blob<256U>::begin(in_RDI);
    WriteLE32((uchar *)ptr,(uint32_t)((ulong)in_RDI >> 0x20));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (uint256 *)ptr;
  }
  __stack_chk_fail();
}

Assistant:

uint256 ArithToUint256(const arith_uint256 &a)
{
    uint256 b;
    for(int x=0; x<a.WIDTH; ++x)
        WriteLE32(b.begin() + x*4, a.pn[x]);
    return b;
}